

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true> __thiscall
duckdb::FSSTStorage::InitCompression
          (FSSTStorage *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  _func_int **pp_Var1;
  duckdb_fsst_encoder_t *encoder;
  u32 uVar2;
  pointer pAVar3;
  pointer pFVar4;
  InternalException *this_00;
  allocator local_49;
  unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
  local_48;
  string local_40;
  
  pAVar3 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->(analyze_state_p);
  make_uniq<duckdb::FSSTCompressionState,duckdb::ColumnDataCheckpointData&,duckdb::CompressionInfo&>
            ((duckdb *)&local_48,checkpoint_data,&pAVar3->info);
  pp_Var1 = pAVar3[1]._vptr_AnalyzeState;
  if (pp_Var1 != (_func_int **)0x0) {
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->(&local_48);
    pFVar4->fsst_encoder = pp_Var1;
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->(&local_48);
    encoder = pFVar4->fsst_encoder;
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->(&local_48);
    uVar2 = duckdb_fsst_export(encoder,pFVar4->fsst_serialized_symbol_table);
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->(&local_48);
    pFVar4->fsst_serialized_symbol_table_size = (ulong)uVar2;
    pAVar3[1]._vptr_AnalyzeState = (_func_int **)0x0;
    *(unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>_> *
     )this = local_48.
             super_unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FSSTCompressionState_*,_std::default_delete<duckdb::FSSTCompressionState>_>
             .super__Head_base<0UL,_duckdb::FSSTCompressionState_*,_false>._M_head_impl;
    return (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
           (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
           this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"No encoder found during FSST compression",&local_49);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CompressionState> FSSTStorage::InitCompression(ColumnDataCheckpointData &checkpoint_data,
                                                          unique_ptr<AnalyzeState> analyze_state_p) {
	auto &analyze_state = analyze_state_p->Cast<FSSTAnalyzeState>();
	auto compression_state = make_uniq<FSSTCompressionState>(checkpoint_data, analyze_state.info);

	if (analyze_state.fsst_encoder == nullptr) {
		throw InternalException("No encoder found during FSST compression");
	}

	compression_state->fsst_encoder = analyze_state.fsst_encoder;
	compression_state->fsst_serialized_symbol_table_size =
	    duckdb_fsst_export(compression_state->fsst_encoder, &compression_state->fsst_serialized_symbol_table[0]);
	analyze_state.fsst_encoder = nullptr;

	return std::move(compression_state);
}